

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O1

string * OpenMD::stripComments(string *__return_storage_ptr__,string *S)

{
  char cVar1;
  uint uVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar2 = (uint)S->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (uVar2 != 0) {
    bVar4 = false;
    uVar7 = 0;
    bVar5 = false;
    do {
      uVar6 = (uint)uVar7;
      if ((bVar4) && ((S->_M_dataplus)._M_p[uVar7] == '\n')) {
        bVar4 = false;
      }
      else if ((bVar5) && (pcVar3 = (S->_M_dataplus)._M_p, pcVar3[uVar7] == '*')) {
        if (pcVar3[uVar6 + 1] == '/') {
          bVar5 = false;
          uVar6 = uVar6 + 1;
        }
      }
      else if (!(bool)(bVar5 | bVar4)) {
        pcVar3 = (S->_M_dataplus)._M_p;
        cVar1 = pcVar3[uVar7];
        if (cVar1 == '/') {
          if (pcVar3[uVar6 + 1] == '/') {
LAB_001eba1b:
            bVar4 = true;
            uVar6 = uVar6 + 1;
            goto LAB_001eba2e;
          }
        }
        else if (cVar1 == '#') goto LAB_001eba1b;
        if ((cVar1 == '/') && (pcVar3[uVar6 + 1] == '*')) {
          bVar5 = true;
          uVar6 = uVar6 + 1;
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
      }
LAB_001eba2e:
      uVar7 = (ulong)(uVar6 + 1);
    } while (uVar6 + 1 < uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stripComments(const std::string& S) {
    unsigned int n = S.length();
    std::string res;

    // Flags to indicate that single line and multpile line comments
    // have started or not.
    bool s_cmt = false;
    bool m_cmt = false;

    // Traverse the line
    for (unsigned int i = 0; i < n; i++) {
      // If single line comment flag is on, then check for end of it
      if (s_cmt == true && S[i] == '\n') s_cmt = false;

      // If multiple line comment is on, then check for end of it
      else if (m_cmt == true && S[i] == '*' && S[i + 1] == '/')
        m_cmt = false, i++;

      // If this character is in a comment, ignore it
      else if (s_cmt || m_cmt)
        continue;

      // Check for beginning of comments and set the approproate flags
      else if ((S[i] == '/' && S[i + 1] == '/') || (S[i] == '#'))
        s_cmt = true, i++;
      else if (S[i] == '/' && S[i + 1] == '*')
        m_cmt = true, i++;

      // If current character is a non-comment character, append it to res
      else
        res += S[i];
    }
    return res;
  }